

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O0

void __thiscall
btHashMap<btHashPtr,_btCollisionShape_*>::clear(btHashMap<btHashPtr,_btCollisionShape_*> *this)

{
  btAlignedObjectArray<btHashPtr> *in_RDI;
  
  btAlignedObjectArray<int>::clear((btAlignedObjectArray<int> *)in_RDI);
  btAlignedObjectArray<int>::clear((btAlignedObjectArray<int> *)in_RDI);
  btAlignedObjectArray<btCollisionShape_*>::clear
            ((btAlignedObjectArray<btCollisionShape_*> *)in_RDI);
  btAlignedObjectArray<btHashPtr>::clear(in_RDI);
  return;
}

Assistant:

void	clear()
	{
		m_hashTable.clear();
		m_next.clear();
		m_valueArray.clear();
		m_keyArray.clear();
	}